

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

int Saig_StrSimIsZero(Aig_Obj_t *pObj)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x10) {
      return 1;
    }
    lVar1 = lVar2 * 4;
    lVar2 = lVar2 + 1;
  } while (*(int *)((long)(pObj->field_5).pData + lVar1) == 0);
  return 0;
}

Assistant:

int Saig_StrSimIsZero( Aig_Obj_t * pObj )
{
    unsigned * pSims = (unsigned *)pObj->pData;
    int i;
    for ( i = 0; i < SAIG_WORDS; i++ )
        if ( pSims[i] != 0 )
            return 0;
    return 1;
}